

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O0

Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
__thiscall
Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
          (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *other)

{
  Matrix<double,__1,__1,_0,__1,__1> *lhs;
  Matrix<double,__1,_1,_0,__1,_1> *rhs;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *other_local;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_local;
  
  lhs = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::derived
                  ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
  rhs = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::derived
                  ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)other);
  Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
  Product((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
           *)&this_local,lhs,rhs);
  return _this_local;
}

Assistant:

inline const Product<Derived, OtherDerived>
MatrixBase<Derived>::operator*(const MatrixBase<OtherDerived> &other) const
{
  // A note regarding the function declaration: In MSVC, this function will sometimes
  // not be inlined since DenseStorage is an unwindable object for dynamic
  // matrices and product types are holding a member to store the result.
  // Thus it does not help tagging this function with EIGEN_STRONG_INLINE.
  enum {
    ProductIsValid =  Derived::ColsAtCompileTime==Dynamic
                   || OtherDerived::RowsAtCompileTime==Dynamic
                   || int(Derived::ColsAtCompileTime)==int(OtherDerived::RowsAtCompileTime),
    AreVectors = Derived::IsVectorAtCompileTime && OtherDerived::IsVectorAtCompileTime,
    SameSizes = EIGEN_PREDICATE_SAME_MATRIX_SIZE(Derived,OtherDerived)
  };
  // note to the lost user:
  //    * for a dot product use: v1.dot(v2)
  //    * for a coeff-wise product use: v1.cwiseProduct(v2)
  EIGEN_STATIC_ASSERT(ProductIsValid || !(AreVectors && SameSizes),
    INVALID_VECTOR_VECTOR_PRODUCT__IF_YOU_WANTED_A_DOT_OR_COEFF_WISE_PRODUCT_YOU_MUST_USE_THE_EXPLICIT_FUNCTIONS)
  EIGEN_STATIC_ASSERT(ProductIsValid || !(SameSizes && !AreVectors),
    INVALID_MATRIX_PRODUCT__IF_YOU_WANTED_A_COEFF_WISE_PRODUCT_YOU_MUST_USE_THE_EXPLICIT_FUNCTION)
  EIGEN_STATIC_ASSERT(ProductIsValid || SameSizes, INVALID_MATRIX_PRODUCT)
#ifdef EIGEN_DEBUG_PRODUCT
  internal::product_type<Derived,OtherDerived>::debug();
#endif

  return Product<Derived, OtherDerived>(derived(), other.derived());
}